

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Type __thiscall
wasm::TypeBuilder::getTempRefType(TypeBuilder *this,HeapType type,Nullability nullable)

{
  pointer this_00;
  TypeInfo local_50;
  uintptr_t local_30;
  Nullability local_24;
  TypeBuilder *pTStack_20;
  Nullability nullable_local;
  TypeBuilder *this_local;
  HeapType type_local;
  
  local_24 = nullable;
  pTStack_20 = this;
  this_local = (TypeBuilder *)type.id;
  this_00 = std::unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ::operator->(&this->impl);
  anon_unknown_0::TypeInfo::TypeInfo(&local_50,(HeapType)this_local,local_24);
  local_30 = (uintptr_t)
             anon_unknown_0::Store<wasm::(anonymous_namespace)::TypeInfo>::insert
                       (&this_00->typeStore,&local_50);
  type_local.id = (uintptr_t)anon_unknown_0::markTemp((Type)local_30);
  anon_unknown_0::TypeInfo::~TypeInfo(&local_50);
  return (Type)type_local.id;
}

Assistant:

Type TypeBuilder::getTempRefType(HeapType type, Nullability nullable) {
  return markTemp(impl->typeStore.insert(TypeInfo(type, nullable)));
}